

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

void __thiscall capnp::SchemaLoader::Validator::validate(Validator *this,Reader *constNode)

{
  int iVar1;
  CapTableReader *pCVar2;
  bool dummy2;
  uint dummy1;
  bool local_a1;
  PointerReader local_a0;
  StructReader local_80;
  StructReader local_50;
  
  iVar1 = 0x7fffffff;
  if ((constNode->_reader).pointerCount < 4) {
    local_80.capTable = (CapTableReader *)0x0;
    local_80.data = (WirePointer *)0x0;
    local_80.segment = (SegmentReader *)0x0;
    local_80.pointers._0_4_ = 0x7fffffff;
  }
  else {
    local_80.segment = (constNode->_reader).segment;
    local_80.capTable = (constNode->_reader).capTable;
    local_80.data = (constNode->_reader).pointers + 3;
    local_80.pointers._0_4_ = (constNode->_reader).nestingLimit;
  }
  pCVar2 = (CapTableReader *)0x0;
  capnp::_::PointerReader::getStruct(&local_50,(PointerReader *)&local_80,(word *)0x0);
  local_a0.pointer = (WirePointer *)0x0;
  local_a0.segment = (SegmentReader *)0x0;
  if (4 < (constNode->_reader).pointerCount) {
    local_a0.segment = (constNode->_reader).segment;
    pCVar2 = (constNode->_reader).capTable;
    local_a0.pointer = (constNode->_reader).pointers + 4;
    iVar1 = (constNode->_reader).nestingLimit;
  }
  local_a0.capTable = pCVar2;
  local_a0.nestingLimit = iVar1;
  capnp::_::PointerReader::getStruct(&local_80,&local_a0,(word *)0x0);
  validate(this,(Reader *)&local_50,(Reader *)&local_80,(uint *)&local_a0,&local_a1);
  return;
}

Assistant:

void validate(const schema::Node::Const::Reader& constNode) {
    uint dummy1;
    bool dummy2;
    validate(constNode.getType(), constNode.getValue(), &dummy1, &dummy2);
  }